

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O0

ssize_t AbstractFileBuffer::read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ByteBuffer *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FileBufferException *this_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  offset_t oVar5;
  undefined4 in_register_0000003c;
  QFile *fIn;
  bool local_f9;
  void *local_e8;
  bufsize_t maxSize;
  offset_t maxOffset;
  offset_t prevOffset;
  bufsize_t readSize;
  QString local_b8;
  long local_a0;
  bufsize_t contentSize;
  char *content;
  CustomException anon_var_0;
  ByteBuffer *bufferedFile;
  bufsize_t allocSize;
  bufsize_t readableSize;
  bool allowTruncate_local;
  bufsize_t minBufSize_local;
  QFile *fIn_local;
  
  fIn = (QFile *)CONCAT44(in_register_0000003c,__fd);
  local_e8 = (void *)getReadableSize(fIn);
  if (local_e8 < __buf) {
    local_e8 = __buf;
  }
  do {
    this = (ByteBuffer *)operator_new(0x28);
    ByteBuffer::ByteBuffer(this,(bufsize_t)local_e8,2);
    local_f9 = this == (ByteBuffer *)0x0 && local_e8 != (void *)0x0;
  } while (local_f9);
  iVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[3])();
  contentSize = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[2])();
  local_a0 = CONCAT44(extraout_var_00,iVar1);
  if ((contentSize == 0) || (local_a0 == 0)) {
    this_00 = (FileBufferException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_b8,"Cannot allocate buffer");
    FileBufferException::FileBufferException(this_00,&local_b8);
    __cxa_throw(this_00,&FileBufferException::typeinfo,FileBufferException::~FileBufferException);
  }
  prevOffset = 0;
  maxOffset = 0;
  uVar2 = local_a0 - 1;
  while (uVar3 = (**(code **)(*(long *)fIn + 0x78))(), uVar3 < uVar2) {
    lVar4 = QIODevice::read((char *)fIn,contentSize + prevOffset);
    prevOffset = lVar4 + prevOffset;
    oVar5 = (**(code **)(*(long *)fIn + 0x78))();
    if (maxOffset == oVar5) break;
    maxOffset = (**(code **)(*(long *)fIn + 0x78))();
  }
  Logger::append(D_INFO,"Read size: %lX",prevOffset);
  return (ssize_t)this;
}

Assistant:

ByteBuffer* AbstractFileBuffer::read(QFile &fIn, bufsize_t minBufSize, const bool allowTruncate) //throws exceptions
{
    bufsize_t readableSize = getReadableSize(fIn);
    bufsize_t allocSize = (readableSize < minBufSize) ? minBufSize : readableSize;

    ByteBuffer *bufferedFile = NULL;
    do {
        try {
            bufferedFile = new ByteBuffer(allocSize); //throws exceptions
        }
        catch (CustomException)
        {
            if (!allowTruncate) throw;
            allocSize /= 2;
        }
    } while(!bufferedFile && allocSize);

    char *content = (char*) bufferedFile->getContent();
    bufsize_t contentSize = bufferedFile->getContentSize();

    if (!content || !contentSize) throw FileBufferException("Cannot allocate buffer");
    //printf("Reading...%lx , BUFSIZE_MAX = %lx\n", allocSize, BUFSIZE_MAX);

    bufsize_t readSize = 0;
    offset_t prevOffset = 0;
    offset_t maxOffset = contentSize - 1;

    while (offset_t(fIn.pos()) < maxOffset) {

        bufsize_t maxSize = contentSize - readSize;
        if (maxSize > FILEVIEW_MAXSIZE) maxSize = FILEVIEW_MAXSIZE;

        readSize += fIn.read(content + readSize,  maxSize);
        if (prevOffset == fIn.pos()) break; //cannot read more!
        prevOffset = fIn.pos();
    }
    Logger::append(Logger::D_INFO,
        "Read size: %lX",
        static_cast<unsigned long>(readSize)
    );
    return bufferedFile;
}